

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

string * BasePort::DefaultPort_abi_cxx11_(void)

{
  string *in_RDI;
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)in_RDI,"fw:0",&local_9);
  return in_RDI;
}

Assistant:

std::string BasePort::DefaultPort(void)
{
#if Amp1394_HAS_RAW1394
    return "fw:0";
#elif Amp1394_HAS_EMIO
    return "emio";
#else
    return "udp:" ETH_UDP_DEFAULT_IP;
#endif

}